

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O3

void xc_available_functional_names(char **list)

{
  int iVar1;
  undefined1 auVar2 [16];
  int *piVar3;
  void *__base;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  long lVar11;
  
  piVar3 = &xc_functional_keys[0].number;
  lVar7 = 1;
  lVar6 = -0x100000000;
  do {
    lVar6 = lVar6 + 0x100000000;
    lVar7 = lVar7 + -1;
    iVar1 = *piVar3;
    piVar3 = piVar3 + 0x41;
  } while (iVar1 != -1);
  __base = malloc(lVar6 >> 0x1e);
  auVar2 = _DAT_01021160;
  if (lVar7 == 0) {
    qsort(__base,lVar6 >> 0x20,4,compare_func_names);
  }
  else {
    uVar8 = -(int)lVar7;
    uVar4 = 1;
    if (1 < (int)uVar8) {
      uVar4 = (ulong)uVar8;
    }
    lVar11 = uVar4 - 1;
    auVar9._8_4_ = (int)lVar11;
    auVar9._0_8_ = lVar11;
    auVar9._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar5 = 0;
    auVar9 = auVar9 ^ _DAT_01021160;
    auVar10 = _DAT_01021150;
    do {
      auVar12 = auVar10 ^ auVar2;
      if ((bool)(~(auVar12._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar12._0_4_ ||
                  auVar9._4_4_ < auVar12._4_4_) & 1)) {
        *(int *)((long)__base + uVar5 * 4) = (int)uVar5;
      }
      if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
          auVar12._12_4_ <= auVar9._12_4_) {
        *(int *)((long)__base + uVar5 * 4 + 4) = (int)uVar5 + 1;
      }
      uVar5 = uVar5 + 2;
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
    } while (((int)uVar4 + 1U & 0xfffffffe) != uVar5);
    qsort(__base,lVar6 >> 0x20,4,compare_func_names);
    if (lVar7 != 0) {
      uVar4 = 1;
      if (1 < (int)uVar8) {
        uVar4 = (ulong)uVar8;
      }
      uVar5 = 0;
      do {
        strcpy(list[uVar5],xc_functional_keys[*(int *)((long)__base + uVar5 * 4)].name);
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
  }
  libxc_free(__base);
  return;
}

Assistant:

void xc_available_functional_names(char **list)
{
  int ii, N;
  int *idlist;

  /* Arrange list of functional IDs by name */
  N=xc_number_of_functionals();
  idlist=(int *) libxc_malloc(N*sizeof(int));
  for(ii=0;ii<N;ii++) {
    idlist[ii]=ii;
  }
  qsort(idlist, N, sizeof(int), compare_func_names);

  /* Now store the correctly ordered output */
  for(ii=0;ii<N;ii++) {
    strcpy(list[ii],xc_functional_keys[idlist[ii]].name);
  }

  /* Deallocate work array */
  libxc_free(idlist);
}